

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_201151b::BIP32PubkeyProvider::ToPrivateString
          (BIP32PubkeyProvider *this,SigningProvider *arg,string *out)

{
  long lVar1;
  char __c;
  bool bVar2;
  long in_FS_OFFSET;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  CExtKey key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  key.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  key.key.fCompressed = false;
  key.key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  bVar2 = GetExtKey(this,arg,&key);
  if (bVar2) {
    EncodeExtKey_abi_cxx11_(&local_b0,&key);
    FormatHDKeypath_abi_cxx11_(&local_d0,&this->m_path,this->m_apostrophe);
    std::operator+(&local_90,&local_b0,&local_d0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (out,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    if (this->m_derive != NO) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (out,"/*");
      if (this->m_derive == HARDENED) {
        __c = 'h';
        if (this->m_apostrophe != false) {
          __c = '\'';
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (out,__c);
      }
    }
  }
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key.key.keydata);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool ToPrivateString(const SigningProvider& arg, std::string& out) const override
    {
        CExtKey key;
        if (!GetExtKey(arg, key)) return false;
        out = EncodeExtKey(key) + FormatHDKeypath(m_path, /*apostrophe=*/m_apostrophe);
        if (IsRange()) {
            out += "/*";
            if (m_derive == DeriveType::HARDENED) out += m_apostrophe ? '\'' : 'h';
        }
        return true;
    }